

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

void __thiscall n_e_s::core::Ppu::update_counters(Ppu *this)

{
  bool bVar1;
  uint16_t *puVar2;
  Ppu *this_local;
  
  puVar2 = cycle(this);
  if (*puVar2 == 0x154) {
    puVar2 = cycle(this);
    *puVar2 = 0;
    puVar2 = scanline(this);
    if (*puVar2 == 0x105) {
      puVar2 = scanline(this);
      *puVar2 = 0;
      this->registers_->odd_frame = (bool)((this->registers_->odd_frame ^ 0xffU) & 1);
      if (((this->registers_->odd_frame & 1U) != 0) &&
         (bVar1 = PpuMask::is_rendering_enabled(&this->registers_->mask), bVar1)) {
        puVar2 = cycle(this);
        *puVar2 = 1;
      }
    }
    else {
      puVar2 = scanline(this);
      *puVar2 = *puVar2 + 1;
    }
  }
  else {
    puVar2 = cycle(this);
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void Ppu::update_counters() {
    if (cycle() == kLastCycleInScanline) {
        cycle() = 0;
        if (scanline() == kLastScanlineInFrame) {
            scanline() = 0;
            registers_->odd_frame = !registers_->odd_frame;
            if (registers_->odd_frame &&
                    registers_->mask.is_rendering_enabled()) {
                cycle() = 1;
            }
        } else {
            ++scanline();
        }
    } else {
        ++cycle();
    }
}